

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall ptc::Print<wchar_t>::Print(Print<wchar_t> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  s_abi_cxx11_(&local_30,"\n",1);
  anon_unknown_4::StringConverter<wchar_t>(&this->end,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  s_abi_cxx11_(&local_30," ",1);
  anon_unknown_4::StringConverter<wchar_t>(&this->sep,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->pattern)._M_dataplus._M_p = (pointer)&(this->pattern).field_2;
  (this->pattern)._M_string_length = 0;
  (this->pattern).field_2._M_local_buf[0] = L'\0';
  this->flush = false;
  return;
}

Assistant:

explicit Print(): 
     end( StringConverter<T_str>( "\n"s ) ),
     sep( StringConverter<T_str>( " "s ) ),
     flush( false )
     {       
      #ifdef PTC_ENABLE_PERFORMANCE_IMPROVEMENTS
      performance_options();
      #endif
     }